

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_bench.cc
# Opt level: O0

void do_bench(void)

{
  fdb_status fVar1;
  char *pcVar2;
  UI_STRING *pUVar3;
  fdb_kvs_handle *in_stack_ffffffffffffc4e8;
  fdb_file_handle *in_stack_ffffffffffffc4f0;
  int in_stack_ffffffffffffc518;
  int in_stack_ffffffffffffc51c;
  StatAggregator *in_stack_ffffffffffffc520;
  int in_stack_ffffffffffffc54c;
  fdb_file_handle **in_stack_ffffffffffffc550;
  char *in_stack_ffffffffffffc5d8;
  int in_stack_ffffffffffffc5e4;
  char *in_stack_ffffffffffffc5e8;
  StatAggregator *in_stack_ffffffffffffc5f0;
  int in_stack_ffffffffffffc60c;
  fdb_kvs_handle *in_stack_ffffffffffffc610;
  fdb_kvs_config *in_stack_ffffffffffffc690;
  char *in_stack_ffffffffffffc698;
  fdb_kvs_handle **in_stack_ffffffffffffc6a0;
  fdb_file_handle *in_stack_ffffffffffffc6a8;
  fdb_config *in_stack_ffffffffffffc708;
  char *in_stack_ffffffffffffc710;
  fdb_file_handle **in_stack_ffffffffffffc718;
  fdb_seqnum_t in_stack_ffffffffffffc790;
  fdb_kvs_handle **in_stack_ffffffffffffc798;
  fdb_kvs_handle *in_stack_ffffffffffffc7a0;
  StatMatrix_t local_1318 [256];
  UI *local_b18 [271];
  undefined8 uStack_2a0;
  long *local_298;
  long *local_290;
  long *local_278;
  StatAggregator *sa;
  reader_context *ctx;
  fdb_config fconfig;
  fdb_kvs_config kvs_config;
  fdb_kvs_handle **snap_db;
  fdb_kvs_handle **db;
  fdb_file_handle **dbfile;
  fdb_status status;
  int n2_kvs;
  char dbname [64];
  char fname [64];
  char cmd [64];
  int n_kvs;
  int n_loops;
  int r;
  int j;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  uStack_2a0 = 0x1051d8;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  sa = (StatAggregator *)&stack0xffffffffffffc4e8;
  local_290 = (long *)operator_new(0x10);
  StatAggregator::StatAggregator
            (in_stack_ffffffffffffc520,in_stack_ffffffffffffc51c,in_stack_ffffffffffffc518);
  local_278 = local_290;
  for (r = 0; r < 0x100; r = r + 1) {
    std::__cxx11::string::assign((char *)(*(long *)*local_278 + (long)r * 0x38));
    std::__cxx11::string::assign((char *)(*(long *)(*local_278 + 8) + (long)r * 0x38));
    std::__cxx11::string::assign((char *)(*(long *)(*local_278 + 0x10) + (long)r * 0x38));
    std::__cxx11::string::assign((char *)(*(long *)(*local_278 + 0x18) + (long)r * 0x38));
    *(long *)((long)sa + (long)r * 0x28 + 8) = *(long *)*local_278 + (long)r * 0x38;
    *(long *)((long)sa + (long)r * 0x28 + 0x18) = *(long *)(*local_278 + 8) + (long)r * 0x38;
    *(long *)((long)sa + (long)r * 0x28 + 0x10) = *(long *)(*local_278 + 0x10) + (long)r * 0x38;
    *(long *)((long)sa + (long)r * 0x28 + 0x20) = *(long *)(*local_278 + 0x18) + (long)r * 0x38;
  }
  sprintf(fname + 0x38,"rm bench* > errorlog.txt");
  system(fname + 0x38);
  fconfig.flags._2_1_ = 0;
  fconfig.wal_threshold._1_1_ = 0;
  fconfig.compaction_minimum_filesize = 600;
  fconfig.multi_kv_instances = false;
  fconfig._65_7_ = 0;
  fconfig.max_writer_lock_prob = 1;
  fconfig.enable_background_compactor = false;
  fconfig._129_7_ = 0;
  r = 0;
  while( true ) {
    if (0xf < r) {
      r = 0;
      do {
        if (9 < r) {
          n_loops = 0;
          while( true ) {
            if (4 < n_loops) {
              r = 0;
              while( true ) {
                if (0xf < r) {
                  StatAggregator::aggregateAndPrintStats
                            (in_stack_ffffffffffffc5f0,in_stack_ffffffffffffc5e8,
                             in_stack_ffffffffffffc5e4,in_stack_ffffffffffffc5d8);
                  local_298 = local_278;
                  if (local_278 != (long *)0x0) {
                    StatAggregator::~StatAggregator(in_stack_ffffffffffffc520);
                    operator_delete(local_298);
                  }
                  print_db_stats(in_stack_ffffffffffffc550,in_stack_ffffffffffffc54c);
                  for (r = 0; r < 0x100; r = r + 1) {
                    fdb_kvs_close(in_stack_ffffffffffffc4e8);
                    fdb_kvs_close(in_stack_ffffffffffffc4e8);
                  }
                  for (r = 0; r < 0x10; r = r + 1) {
                    fdb_close((fdb_file_handle *)in_stack_ffffffffffffc4e8);
                  }
                  fdb_shutdown();
                  sprintf(fname + 0x38,"rm bench* > errorlog.txt");
                  system(fname + 0x38);
                  if (do_bench::__test_pass == 0) {
                    fprintf(_stderr,"%s FAILED\n","Benchmark done");
                  }
                  else {
                    fprintf(_stderr,"%s PASSED\n","Benchmark done");
                  }
                  return;
                }
                fVar1 = fdb_compact(in_stack_ffffffffffffc4f0,(char *)in_stack_ffffffffffffc4e8);
                if (fVar1 != FDB_RESULT_SUCCESS) break;
                r = r + 1;
              }
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                            ,0x16b,"void do_bench()");
            }
            pUVar3 = (UI_STRING *)0x0;
            writer(local_b18[0],(UI_STRING *)0x0);
            sa->t_stats = (StatMatrix_t)local_b18[0];
            reader((UI *)sa,pUVar3);
            pcVar2 = (char *)local_1318;
            fVar1 = fdb_snapshot_open(in_stack_ffffffffffffc7a0,in_stack_ffffffffffffc798,
                                      in_stack_ffffffffffffc790);
            if (fVar1 != FDB_RESULT_SUCCESS) {
              pcVar2 = "Test failed: %s %d\n";
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                      ,0x121);
              do_bench::__test_pass = 0;
              if (fVar1 != FDB_RESULT_SUCCESS) {
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                              ,0x121,"void do_bench()");
              }
            }
            sa->t_stats = local_1318[0];
            reader((UI *)sa,(UI_STRING *)pcVar2);
            for (r = 0; r < 0x10; r = r + 1) {
              pcVar2 = (char *)(ulong)(uint)r;
              writer(local_b18[r],(UI_STRING *)pcVar2);
            }
            for (r = 0; r < 0x10; r = r + 1) {
              pcVar2 = (char *)(ulong)(uint)r;
              deletes(in_stack_ffffffffffffc610,in_stack_ffffffffffffc60c);
            }
            for (r = 0; r < 0x10; r = r + 1) {
              *(UI **)((long)sa + (long)r * 0x28) = local_b18[r];
              reader((UI *)((long)sa + (long)r * 0x28),(UI_STRING *)pcVar2);
            }
            for (r = 0; r < 0x10; r = r + 1) {
              pcVar2 = (char *)((UI_STRING *)local_1318 + (long)r * 8);
              fVar1 = fdb_snapshot_open(in_stack_ffffffffffffc7a0,in_stack_ffffffffffffc798,
                                        in_stack_ffffffffffffc790);
              if (fVar1 != FDB_RESULT_SUCCESS) {
                pcVar2 = "Test failed: %s %d\n";
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                        ,0x133);
                do_bench::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                                ,0x133,"void do_bench()");
                }
              }
              *(undefined8 *)((long)sa + (long)r * 0x28) =
                   *(undefined8 *)((UI_STRING *)local_1318 + (long)r * 8);
              reader((UI *)((long)sa + (long)r * 0x28),(UI_STRING *)pcVar2);
            }
            pUVar3 = (UI_STRING *)0x1;
            fVar1 = fdb_commit((fdb_file_handle *)in_stack_ffffffffffffc4e8,'\0');
            if (fVar1 != FDB_RESULT_SUCCESS) break;
            for (r = 0; r < 0x100; r = r + 0x10) {
              pUVar3 = (UI_STRING *)(ulong)(uint)r;
              writer(local_b18[r],pUVar3);
            }
            for (r = 0; r < 0x100; r = r + 0x10) {
              pUVar3 = (UI_STRING *)(ulong)(uint)r;
              deletes(in_stack_ffffffffffffc610,in_stack_ffffffffffffc60c);
            }
            for (r = 0; r < 0x100; r = r + 0x10) {
              *(UI **)((long)sa + (long)r * 0x28) = local_b18[r];
              reader((UI *)((long)sa + (long)r * 0x28),pUVar3);
            }
            for (r = 0; r < 0x100; r = r + 0x10) {
              pUVar3 = (UI_STRING *)local_1318 + (long)r * 8;
              fVar1 = fdb_snapshot_open(in_stack_ffffffffffffc7a0,in_stack_ffffffffffffc798,
                                        in_stack_ffffffffffffc790);
              if (fVar1 != FDB_RESULT_SUCCESS) {
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                              ,0x14a,"void do_bench()");
              }
              *(undefined8 *)((long)sa + (long)r * 0x28) =
                   *(undefined8 *)((UI_STRING *)local_1318 + (long)r * 8);
              reader((UI *)((long)sa + (long)r * 0x28),pUVar3);
            }
            for (r = 0; r < 0x100; r = r + 1) {
              pUVar3 = (UI_STRING *)(ulong)(uint)r;
              writer(local_b18[r],pUVar3);
            }
            for (r = 0; r < 0x100; r = r + 1) {
              pUVar3 = (UI_STRING *)(ulong)(uint)r;
              deletes(in_stack_ffffffffffffc610,in_stack_ffffffffffffc60c);
            }
            for (r = 0; r < 0x100; r = r + 1) {
              *(UI **)((long)sa + (long)r * 0x28) = local_b18[r];
              reader((UI *)((long)sa + (long)r * 0x28),pUVar3);
            }
            for (r = 0; r < 0x100; r = r + 1) {
              pUVar3 = (UI_STRING *)local_1318 + (long)r * 8;
              fVar1 = fdb_snapshot_open(in_stack_ffffffffffffc7a0,in_stack_ffffffffffffc798,
                                        in_stack_ffffffffffffc790);
              if (fVar1 != FDB_RESULT_SUCCESS) {
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                              ,0x15d,"void do_bench()");
              }
              *(undefined8 *)((long)sa + (long)r * 0x28) =
                   *(undefined8 *)((UI_STRING *)local_1318 + (long)r * 8);
              reader((UI *)((long)sa + (long)r * 0x28),pUVar3);
            }
            for (r = 0; r < 0x10; r = r + 1) {
              fVar1 = fdb_commit((fdb_file_handle *)in_stack_ffffffffffffc4e8,'\0');
              if (fVar1 != FDB_RESULT_SUCCESS) {
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                              ,0x165,"void do_bench()");
              }
            }
            n_loops = n_loops + 1;
          }
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                        ,0x13a,"void do_bench()");
        }
        for (r = 0; r < 0x10; r = r + 1) {
          fVar1 = fdb_commit((fdb_file_handle *)in_stack_ffffffffffffc4e8,'\0');
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                          ,0x111,"void do_bench()");
          }
        }
        r = r + 1;
      } while( true );
    }
    sprintf(dbname + 0x38,"bench%d",(ulong)(uint)r);
    fVar1 = fdb_open(in_stack_ffffffffffffc718,in_stack_ffffffffffffc710,in_stack_ffffffffffffc708);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    for (n_loops = r * 0x10; n_loops < r * 0x10 + 0x10; n_loops = n_loops + 1) {
      sprintf((char *)&status,"db%d",(ulong)(uint)n_loops);
      fVar1 = fdb_kvs_open(in_stack_ffffffffffffc6a8,in_stack_ffffffffffffc6a0,
                           in_stack_ffffffffffffc698,in_stack_ffffffffffffc690);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                      ,0x109,"void do_bench()");
      }
    }
    r = r + 1;
  }
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/fdbench-micro/fdb_bench.cc"
                ,0x103,"void do_bench()");
}

Assistant:

void do_bench() {

    TEST_INIT();
    int i, j, r;
    int n_loops = 5;
    int n_kvs = 16;

    char cmd[64], fname[64], dbname[64];
    int n2_kvs = n_kvs * n_kvs;

    // file handlers
    fdb_status status;
    fdb_file_handle **dbfile = alca(fdb_file_handle*, n_kvs);
    fdb_kvs_handle **db = alca(fdb_kvs_handle*, n2_kvs);
    fdb_kvs_handle **snap_db = alca(fdb_kvs_handle*, n2_kvs);
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();

    // reader stats
    reader_context *ctx = alca(reader_context, n2_kvs);

    StatAggregator *sa = new StatAggregator(4, n2_kvs);

    for (i = 0; i < n2_kvs; ++i) {
        sa->t_stats[0][i].name.assign(ST_ITR_INIT);
        sa->t_stats[1][i].name.assign(ST_ITR_NEXT);
        sa->t_stats[2][i].name.assign(ST_ITR_GET);
        sa->t_stats[3][i].name.assign(ST_ITR_CLOSE);
        ctx[i].stat_itr_init = &sa->t_stats[0][i];
        ctx[i].stat_itr_next = &sa->t_stats[1][i];
        ctx[i].stat_itr_get = &sa->t_stats[2][i];
        ctx[i].stat_itr_close = &sa->t_stats[3][i];
    }

    sprintf(cmd, "rm bench* > errorlog.txt");
    r = system(cmd);
    (void)r;

    // setup
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    fconfig.auto_commit = false;
    fconfig.compactor_sleep_duration = 600;
    fconfig.prefetch_duration = 0;
    fconfig.num_compactor_threads = 1;
    fconfig.num_bgflusher_threads = 0;

    // open 16 dbfiles each with 16 kvs
    for (i = 0; i < n_kvs; ++i){
        sprintf(fname, "bench%d",i);
        status = fdb_open(&dbfile[i], fname, &fconfig);
        assert(status == FDB_RESULT_SUCCESS);

        for (j = i*n_kvs; j < (i*n_kvs + n_kvs); ++j){
            sprintf(dbname, "db%d",j);
            status = fdb_kvs_open(dbfile[i], &db[j],
                                  dbname, &kvs_config);
            assert(status == FDB_RESULT_SUCCESS);
        }
    }

    for (i = 0; i < 10; ++i){
        // generate initial commit headers
        for (i = 0; i < n_kvs; i++){
            status = fdb_commit(dbfile[i], FDB_COMMIT_MANUAL_WAL_FLUSH);
            assert(status == FDB_RESULT_SUCCESS);
        }
    }

    for (j = 0; j < n_loops; j++){

        // write to single file 1 kvs
        writer(db[0], 0);

        // reads from single file 1 kvs
        ctx[0].handle = db[0];
        reader(&ctx[0]);

        // snap iterator read
        status = fdb_snapshot_open(db[0], &snap_db[0],
                                   FDB_SNAPSHOT_INMEM);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        ctx[0].handle = snap_db[0];
        reader(&ctx[0]);

       // write/read/snap to single file 16 kvs
        for (i = 0;i < n_kvs; ++i){
            writer(db[i], i);
        }
        for (i = 0; i < n_kvs; ++i){
            deletes(db[i], i);
        }
        for (i = 0; i < n_kvs; ++i){
            ctx[i].handle = db[i];
            reader(&ctx[i]);
        }
        for (i = 0; i < n_kvs; ++i){
            status = fdb_snapshot_open(db[i], &snap_db[i],
                                       FDB_SNAPSHOT_INMEM);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            ctx[i].handle = snap_db[i];
            reader(&ctx[i]);
        }

        // commit single file
        status = fdb_commit(dbfile[0], FDB_COMMIT_MANUAL_WAL_FLUSH);
        assert(status == FDB_RESULT_SUCCESS);

        // write/write/snap to 16 files 1 kvs
        for (i = 0; i < n2_kvs; i += n_kvs){ // every 16 kvs is new file
            writer(db[i], i);
        }
        for (i = 0; i < n2_kvs; i += n_kvs){
            deletes(db[i], i);
        }
        for (i = 0; i < n2_kvs; i += n_kvs){ // every 16 kvs is new file
            ctx[i].handle = db[i];
            reader(&ctx[i]);
        }
        for (i = 0; i < n2_kvs; i += n_kvs){
            status = fdb_snapshot_open(db[i], &snap_db[i],
                                       FDB_SNAPSHOT_INMEM);
            assert(status == FDB_RESULT_SUCCESS);
            ctx[i].handle = snap_db[i];
            reader(&ctx[i]);
        }

        // write to 16 files 16 kvs each
        for (i = 0; i < n2_kvs; i++){
            writer(db[i], i);
        }
        for (i = 0; i < n2_kvs; ++i){
            deletes(db[i], i);
        }
        for (i = 0; i < n2_kvs; i++){
            ctx[i].handle = db[i];
            reader(&ctx[i]);
        }
        for (i = 0; i < n2_kvs; i++){
            status = fdb_snapshot_open(db[i], &snap_db[i],
                                       FDB_SNAPSHOT_INMEM);
            assert(status == FDB_RESULT_SUCCESS);
            ctx[i].handle = snap_db[i];
            reader(&ctx[i]);
        }

        // commit all
        for (i = 0;i < n_kvs; i++){
            status = fdb_commit(dbfile[i], FDB_COMMIT_MANUAL_WAL_FLUSH);
            assert(status == FDB_RESULT_SUCCESS);
        }
    }
    // compact all
    for (i = 0; i < n_kvs; i++){
        status = fdb_compact(dbfile[i], NULL);
        assert(status == FDB_RESULT_SUCCESS);
    }

    // print aggregated reader stats
    sa->aggregateAndPrintStats("ITERATOR_TEST_STATS", n_kvs * n_kvs, "µs");
    delete sa;

    // print aggregated dbfile stats
    print_db_stats(dbfile, n_kvs);

    // cleanup
    for(i = 0; i < n2_kvs; i++){
        fdb_kvs_close(db[i]);
        fdb_kvs_close(snap_db[i]);
    }
    for(i = 0; i < n_kvs; i++){
        fdb_close(dbfile[i]);
    }

    fdb_shutdown();

    (void)status;
    sprintf(cmd, "rm bench* > errorlog.txt");
    r = system(cmd);
    (void)r;

    TEST_RESULT("Benchmark done");
}